

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_dest,OPJ_UINT32 p_dest_length)

{
  OPJ_UINT32 OVar1;
  int *piVar2;
  OPJ_CHAR *local_a8;
  OPJ_INT32 *l_src_ptr_2;
  OPJ_INT32 *l_dest_ptr_2;
  OPJ_INT16 val_1;
  OPJ_INT32 *pOStack_90;
  OPJ_INT16 val;
  OPJ_INT16 *l_dest_ptr_1;
  OPJ_INT32 *l_src_ptr_1;
  OPJ_INT32 *l_src_ptr;
  OPJ_CHAR *l_dest_ptr;
  OPJ_INT32 *l_src_data;
  uint local_60;
  OPJ_UINT32 l_height;
  OPJ_UINT32 l_width;
  OPJ_UINT32 l_stride;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 l_size_comp;
  opj_tcd_resolution_t *l_res;
  opj_tcd_tilecomp_t *l_tilec;
  opj_image_comp_t *l_img_comp;
  uint local_30;
  OPJ_UINT32 l_data_size;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_UINT32 p_dest_length_local;
  OPJ_BYTE *p_dest_local;
  opj_tcd_t *p_tcd_local;
  
  OVar1 = opj_tcd_get_decoded_tile_size(p_tcd,1);
  if ((OVar1 == 0xffffffff) || (p_dest_length < OVar1)) {
    p_tcd_local._4_4_ = 0;
  }
  else {
    l_res = (opj_tcd_resolution_t *)p_tcd->tcd_image->tiles->comps;
    l_tilec = (opj_tcd_tilecomp_t *)p_tcd->image->comps;
    _i = (OPJ_INT32 *)p_dest;
    for (k = 0; k < p_tcd->image->numcomps; k = k + 1) {
      l_stride = l_tilec->minimum_num_resolutions >> 3;
      piVar2 = (int *)(*(long *)l_res->bands +
                      (ulong)*(uint *)((long)&l_tilec->resolutions + 4) * 0xc0);
      if (p_tcd->whole_tile_decoding == 0) {
        local_60 = piVar2[0x2e] - piVar2[0x2c];
        l_src_data._4_4_ = piVar2[0x2f] - piVar2[0x2d];
        l_height = 0;
        l_dest_ptr = *(OPJ_CHAR **)(l_res->bands + 1);
      }
      else {
        local_60 = piVar2[2] - *piVar2;
        l_src_data._4_4_ = piVar2[3] - piVar2[1];
        l_height = (*(int *)(*(long *)l_res->bands + (ulong)(l_res->numbands - 1) * 0xc0 + 8) -
                   *(int *)(*(long *)l_res->bands + (ulong)(l_res->numbands - 1) * 0xc0)) - local_60
        ;
        l_dest_ptr = *(OPJ_CHAR **)&l_res->bands[0].bandno;
      }
      if ((l_tilec->minimum_num_resolutions & 7) != 0) {
        l_stride = l_stride + 1;
      }
      if (l_stride == 3) {
        l_stride = 4;
      }
      if (l_stride == 1) {
        l_src_ptr = _i;
        l_src_ptr_1 = (OPJ_INT32 *)l_dest_ptr;
        if (*(int *)&l_tilec->resolutions == 0) {
          for (l_data_size = 0; l_data_size < l_src_data._4_4_; l_data_size = l_data_size + 1) {
            for (local_30 = 0; local_30 < local_60; local_30 = local_30 + 1) {
              *(char *)l_src_ptr = (char)*l_src_ptr_1;
              l_src_ptr_1 = l_src_ptr_1 + 1;
              l_src_ptr = (OPJ_INT32 *)((long)l_src_ptr + 1);
            }
            l_src_ptr_1 = l_src_ptr_1 + l_height;
          }
        }
        else {
          for (l_data_size = 0; l_data_size < l_src_data._4_4_; l_data_size = l_data_size + 1) {
            for (local_30 = 0; local_30 < local_60; local_30 = local_30 + 1) {
              *(char *)l_src_ptr = (char)*l_src_ptr_1;
              l_src_ptr_1 = l_src_ptr_1 + 1;
              l_src_ptr = (OPJ_INT32 *)((long)l_src_ptr + 1);
            }
            l_src_ptr_1 = l_src_ptr_1 + l_height;
          }
        }
        _i = l_src_ptr;
      }
      else if (l_stride == 2) {
        l_dest_ptr_1 = (OPJ_INT16 *)l_dest_ptr;
        pOStack_90 = _i;
        if (*(int *)&l_tilec->resolutions == 0) {
          for (l_data_size = 0; l_data_size < l_src_data._4_4_; l_data_size = l_data_size + 1) {
            for (local_30 = 0; local_30 < local_60; local_30 = local_30 + 1) {
              *(short *)pOStack_90 = (short)*(undefined4 *)l_dest_ptr_1;
              pOStack_90 = (OPJ_INT32 *)((long)pOStack_90 + 2);
              l_dest_ptr_1 = l_dest_ptr_1 + 2;
            }
            l_dest_ptr_1 = l_dest_ptr_1 + (ulong)l_height * 2;
          }
        }
        else {
          for (l_data_size = 0; l_data_size < l_src_data._4_4_; l_data_size = l_data_size + 1) {
            for (local_30 = 0; local_30 < local_60; local_30 = local_30 + 1) {
              *(short *)pOStack_90 = (short)*(undefined4 *)l_dest_ptr_1;
              pOStack_90 = (OPJ_INT32 *)((long)pOStack_90 + 2);
              l_dest_ptr_1 = l_dest_ptr_1 + 2;
            }
            l_dest_ptr_1 = l_dest_ptr_1 + (ulong)l_height * 2;
          }
        }
        _i = pOStack_90;
      }
      else if (l_stride == 4) {
        l_src_ptr_2 = _i;
        local_a8 = l_dest_ptr;
        for (l_data_size = 0; l_data_size < l_src_data._4_4_; l_data_size = l_data_size + 1) {
          memcpy(l_src_ptr_2,local_a8,(ulong)local_60 << 2);
          l_src_ptr_2 = l_src_ptr_2 + local_60;
          local_a8 = local_a8 + (ulong)(local_60 + l_height) * 4;
        }
        _i = l_src_ptr_2;
      }
      l_tilec = (opj_tcd_tilecomp_t *)&l_tilec->data_size_needed;
      l_res = (opj_tcd_resolution_t *)&l_res->bands[1].precincts_data_size;
    }
    p_tcd_local._4_4_ = 1;
  }
  return p_tcd_local._4_4_;
}

Assistant:

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,
                                  OPJ_BYTE * p_dest,
                                  OPJ_UINT32 p_dest_length
                                 )
{
    OPJ_UINT32 i, j, k, l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_tcd_resolution_t * l_res;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_stride, l_width, l_height;

    l_data_size = opj_tcd_get_decoded_tile_size(p_tcd, OPJ_TRUE);
    if (l_data_size == UINT_MAX || l_data_size > p_dest_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        const OPJ_INT32* l_src_data;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_res = l_tilec->resolutions + l_img_comp->resno_decoded;
        if (p_tcd->whole_tile_decoding) {
            l_width = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            l_height = (OPJ_UINT32)(l_res->y1 - l_res->y0);
            l_stride = (OPJ_UINT32)(l_tilec->resolutions[l_tilec->minimum_num_resolutions -
                                                                     1].x1 -
                                    l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0) - l_width;
            l_src_data = l_tilec->data;
        } else {
            l_width = l_res->win_x1 - l_res->win_x0;
            l_height = l_res->win_y1 - l_res->win_y0;
            l_stride = 0;
            l_src_data = l_tilec->data_win;
        }

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_dest_ptr = (OPJ_CHAR *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)(*(l_src_ptr++));
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)((*(l_src_ptr++)) & 0xff);
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE *)l_dest_ptr;
        }
        break;
        case 2: {
            const OPJ_INT32 * l_src_ptr = l_src_data;
            OPJ_INT16 * l_dest_ptr = (OPJ_INT16 *) p_dest;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)(*(l_src_ptr++));
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)((*(l_src_ptr++)) & 0xffff);
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_dest_ptr = (OPJ_INT32 *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            for (j = 0; j < l_height; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width * sizeof(OPJ_INT32));
                l_dest_ptr += l_width;
                l_src_ptr += l_width + l_stride;
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}